

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiArg.h
# Opt level: O0

bool __thiscall
TCLAP::MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
isRequired(MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  size_type sVar1;
  MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (((this->super_Arg)._required & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->_values);
    if (sVar1 < 2) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MultiArg<T>::isRequired() const
{
	if ( _required )
	{
		if ( _values.size() > 1 )
			return false;
		else
			return true;
   	}
   	else
		return false;

}